

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

int __thiscall QWidget::heightForWidth(QWidget *this,int w)

{
  long lVar1;
  char cVar2;
  int iVar3;
  
  lVar1 = *(long *)(*(long *)&this->field_0x8 + 0x98);
  if (lVar1 != 0) {
    cVar2 = (**(code **)(*(long *)(lVar1 + 0x10) + 0x48))(lVar1 + 0x10);
    if (cVar2 != '\0') {
      iVar3 = QLayout::totalHeightForWidth(*(QLayout **)(*(long *)&this->field_0x8 + 0x98),w);
      return iVar3;
    }
  }
  return -1;
}

Assistant:

int QWidget::heightForWidth(int w) const
{
    if (layout() && layout()->hasHeightForWidth())
        return layout()->totalHeightForWidth(w);
    return -1;
}